

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O1

uint8_t * quicly_encode_close_frame
                    (uint8_t *base,uint64_t error_code,uint64_t offending_frame_type,
                    char *reason_phrase)

{
  byte *in_RAX;
  size_t __n;
  long lVar1;
  byte *pbVar2;
  
  __n = strlen(reason_phrase);
  if (base == (uint8_t *)0x0) {
    pbVar2 = (byte *)0x2;
    if ((0x3f < error_code) && (pbVar2 = (byte *)0x3, 0x3fff < error_code)) {
      pbVar2 = (byte *)((ulong)(0x3fffffff < error_code) * 4 + 5);
    }
  }
  else {
    *base = offending_frame_type == 0xffffffffffffffff | 0x1c;
    pbVar2 = base + 1;
    if (0x3f < error_code) {
      if (error_code < 0x4000) {
        base[1] = (byte)(error_code >> 8) | 0x40;
        pbVar2 = base + 2;
      }
      else {
        quicly_encode_close_frame_cold_1();
        pbVar2 = in_RAX;
      }
    }
    *pbVar2 = (byte)error_code;
    pbVar2 = pbVar2 + (1 - (long)base);
  }
  if (offending_frame_type != 0xffffffffffffffff) {
    if (base == (uint8_t *)0x0) {
      lVar1 = 1;
      if ((0x3f < offending_frame_type) && (lVar1 = 2, 0x3fff < offending_frame_type)) {
        lVar1 = (ulong)(0x3fffffff < offending_frame_type) * 4 + 4;
      }
      pbVar2 = pbVar2 + lVar1;
    }
    else {
      pbVar2 = base + (long)pbVar2;
      if (0x3f < offending_frame_type) {
        if (offending_frame_type < 0x4000) {
          *pbVar2 = (byte)(offending_frame_type >> 8) | 0x40;
          pbVar2 = pbVar2 + 1;
        }
        else {
          quicly_encode_close_frame_cold_2();
          pbVar2 = in_RAX;
        }
      }
      *pbVar2 = (byte)offending_frame_type;
      pbVar2 = pbVar2 + (1 - (long)base);
    }
  }
  if (base == (uint8_t *)0x0) {
    lVar1 = 1;
    if ((0x3f < __n) && (lVar1 = 2, 0x3fff < __n)) {
      lVar1 = (ulong)(0x3fffffff < __n) * 4 + 4;
    }
    pbVar2 = pbVar2 + lVar1;
  }
  else {
    pbVar2 = base + (long)pbVar2;
    if (0x3f < __n) {
      if (__n < 0x4000) {
        *pbVar2 = (byte)(__n >> 8) | 0x40;
        pbVar2 = pbVar2 + 1;
      }
      else {
        quicly_encode_close_frame_cold_3();
        pbVar2 = in_RAX;
      }
    }
    *pbVar2 = (byte)__n;
    pbVar2 = pbVar2 + (1 - (long)base);
  }
  if (base != (uint8_t *)0x0) {
    memcpy(base + (long)pbVar2,reason_phrase,__n);
  }
  return base + (long)(pbVar2 + __n);
}

Assistant:

uint8_t *quicly_encode_close_frame(uint8_t *const base, uint64_t error_code, uint64_t offending_frame_type,
                                   const char *reason_phrase)
{
    size_t offset = 0, reason_phrase_len = strlen(reason_phrase);

#define PUSHV(v)                                                                                                                   \
    do {                                                                                                                           \
        if (base != NULL) {                                                                                                        \
            offset = quicly_encodev(base + offset, (v)) - base;                                                                    \
        } else {                                                                                                                   \
            offset += quicly_encodev_capacity(v);                                                                                  \
        }                                                                                                                          \
    } while (0)

    PUSHV(offending_frame_type == UINT64_MAX ? QUICLY_FRAME_TYPE_APPLICATION_CLOSE : QUICLY_FRAME_TYPE_TRANSPORT_CLOSE);
    PUSHV(error_code);
    if (offending_frame_type != UINT64_MAX)
        PUSHV(offending_frame_type);
    PUSHV(reason_phrase_len);
    if (base != NULL)
        memcpy(base + offset, reason_phrase, reason_phrase_len);
    offset += reason_phrase_len;

#undef PUSHV

    return base + offset;
}